

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksets_decoder.cpp
# Opt level: O1

uint16_t decode_tile(BitstreamReader *bitstream,TileQueue *tile_queue)

{
  bool bVar1;
  char cVar2;
  int index;
  
  bVar1 = BitstreamReader::next_bit(bitstream);
  index = 0;
  if (bVar1) {
    cVar2 = '\x04';
    do {
      bVar1 = BitstreamReader::next_bit(bitstream);
      index = (uint)bVar1 + index * 2;
      cVar2 = cVar2 + -1;
    } while (cVar2 != '\0');
    TileQueue::move_to_front(tile_queue,index);
  }
  else {
    cVar2 = '\v';
    do {
      bVar1 = BitstreamReader::next_bit(bitstream);
      index = (uint)bVar1 + index * 2;
      cVar2 = cVar2 + -1;
    } while (cVar2 != '\0');
    TileQueue::push_front(tile_queue,(uint16_t)index);
  }
  return *(tile_queue->_tiles).super__Deque_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
}

Assistant:

static uint16_t decode_tile(BitstreamReader& bitstream, TileQueue& tile_queue)
{
    if(bitstream.next_bit())
    {
        uint32_t index = bitstream.read_bits(4);
        tile_queue.move_to_front(index);
    }
    else
    {
        uint32_t val = bitstream.read_bits(11);
        tile_queue.push_front(val);
    }

    return tile_queue.front();
}